

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::TempDir_abi_cxx11_(void)

{
  string *in_RDI;
  char in_R9B;
  initializer_list<const_char_*> environment_variables;
  char *local_30;
  char *local_28;
  testing *local_20;
  undefined8 local_18;
  
  local_30 = "TEST_TMPDIR";
  local_28 = "TMPDIR";
  local_20 = (testing *)&local_30;
  local_18 = 2;
  environment_variables._M_len = (size_type_conflict)"/tmp/";
  environment_variables._M_array = (iterator)0x2;
  GetDirFromEnv_abi_cxx11_(in_RDI,local_20,environment_variables,(char *)0x2f,in_R9B);
  return in_RDI;
}

Assistant:

std::string TempDir() {
#if defined(GTEST_CUSTOM_TEMPDIR_FUNCTION_)
  return GTEST_CUSTOM_TEMPDIR_FUNCTION_();
#elif defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_WINDOWS_MOBILE)
  return GetDirFromEnv({"TEST_TMPDIR", "TEMP"}, "\\temp\\", '\\');
#elif defined(GTEST_OS_LINUX_ANDROID)
  return GetDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/data/local/tmp/", '/');
#else
  return GetDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/tmp/", '/');
#endif
}